

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor-inl.h
# Opt level: O1

void __thiscall spdlog::details::executor::~executor(executor *this)

{
  bool bVar1;
  context *pcVar2;
  logger *plVar3;
  char *pcVar4;
  
  pcVar2 = this->ctx_;
  if (pcVar2 != (context *)0x0) {
    (pcVar2->msg).super_log_msg.params = &(pcVar2->msg).params_buffer;
    plVar3 = pcVar2->lgr;
    bVar1 = pcVar2->traceback_enabled;
    if (pcVar2->log_enabled == true) {
      (*plVar3->_vptr_logger[3])(plVar3,&pcVar2->msg);
    }
    if (bVar1 != false) {
      backtracer::push_back(&plVar3->tracer_,&(pcVar2->msg).super_log_msg);
    }
    pcVar2 = this->ctx_;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy
              ((json_value *)&(pcVar2->msg).params_buffer.m_value.boolean,
               (pcVar2->msg).params_buffer.m_type);
    pcVar4 = (pcVar2->msg).buffer.super_buffer<char>.ptr_;
    if (pcVar4 != (pcVar2->msg).buffer.store_) {
      operator_delete(pcVar4);
      return;
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE executor::~executor() noexcept(false)
{
    if (ctx_)
    {
        ctx_->msg.params = &ctx_->msg.params_buffer;
        try
        {
            ctx_->lgr->executor_callback(ctx_->msg, ctx_->log_enabled, ctx_->traceback_enabled);
        }
        catch (...)
        {
            ctx_->~context();
            throw;
        }
        ctx_->~context();
    }
}